

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O2

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::evalString
          (ManifestLoaderImpl *this,void *userContext,StringRef string,raw_ostream *result,
          function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *lookup,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          error)

{
  char C;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  byte bVar7;
  char *pcVar8;
  StringRef Str;
  StringRef __args_1;
  StringRef __args_1_00;
  allocator local_61;
  void *local_60;
  function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = string.Data + string.Length;
  pcVar6 = string.Data;
  local_60 = userContext;
  local_58 = lookup;
LAB_0012c7fe:
  do {
    if (pcVar6 == pcVar3) {
      return;
    }
    for (sVar4 = 0; (pcVar8 = pcVar6 + sVar4, pcVar8 != pcVar3 && (*pcVar8 != '$'));
        sVar4 = sVar4 + 1) {
    }
    if (sVar4 != 0) {
      Str.Length = sVar4;
      Str.Data = pcVar6;
      llvm::raw_ostream::operator<<(result,Str);
    }
    if (pcVar8 == pcVar3) {
      return;
    }
    pcVar8 = pcVar6 + sVar4 + 1;
    if (pcVar8 == pcVar3) {
      pcVar6 = "invalid \'$\'-escape at end of string";
LAB_0012c9b8:
      std::__cxx11::string::string((string *)&local_50,pcVar6,&local_61);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)error.super__Function_base._M_functor._M_unused._0_8_,&local_50);
      std::__cxx11::string::_M_dispose();
      return;
    }
    C = *pcVar8;
    if (C == '{') {
      bVar7 = 1;
      sVar5 = 0;
      for (pcVar8 = pcVar6 + sVar4 + 2; pcVar8 != pcVar3; pcVar8 = pcVar8 + 1) {
        if (*pcVar8 == '}') {
          if (bVar7 == 0) {
            std::__cxx11::string::string
                      ((string *)&local_50,"invalid variable name in reference",&local_61);
            std::
            function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)error.super__Function_base._M_functor._M_unused._0_8_,&local_50);
            std::__cxx11::string::_M_dispose();
          }
          else {
            __args_1_00.Length = sVar5;
            __args_1_00.Data = pcVar6 + sVar4 + 2;
            std::function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)>::operator()
                      (local_58,local_60,__args_1_00,result);
          }
          pcVar6 = pcVar8 + 1;
          goto LAB_0012c7fe;
        }
        bVar1 = Lexer::isIdentifierChar(*pcVar8);
        bVar7 = bVar7 & bVar1;
        sVar5 = sVar5 + 1;
      }
      std::__cxx11::string::string
                ((string *)&local_50,"invalid variable reference in string (missing trailing \'}\')"
                 ,&local_61);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)error.super__Function_base._M_functor._M_unused._0_8_,&local_50);
      std::__cxx11::string::_M_dispose();
      pcVar6 = pcVar3;
    }
    else if (((C == ' ') || (C == '$')) || (C == ':')) {
      llvm::raw_ostream::operator<<(result,C);
      pcVar6 = pcVar6 + sVar4 + 2;
    }
    else if (C == '\n') {
      pcVar6 = pcVar6 + sVar4 + 2;
      while ((pcVar6 != pcVar3 && (iVar2 = isspace((int)*pcVar6), iVar2 != 0))) {
        pcVar6 = pcVar6 + 1;
      }
    }
    else {
      bVar1 = Lexer::isSimpleIdentifierChar(C);
      if (!bVar1) {
        pcVar6 = "invalid \'$\'-escape (literal \'$\' should be written as \'$$\')";
        goto LAB_0012c9b8;
      }
      pcVar6 = pcVar6 + sVar4 + 2;
      sVar4 = 1;
      while ((pcVar6 != pcVar3 && (bVar1 = Lexer::isSimpleIdentifierChar(*pcVar6), bVar1))) {
        pcVar6 = pcVar6 + 1;
        sVar4 = sVar4 + 1;
      }
      __args_1.Length = sVar4;
      __args_1.Data = pcVar8;
      std::function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)>::operator()
                (local_58,local_60,__args_1,result);
    }
  } while( true );
}

Assistant:

void evalString(void* userContext, StringRef string, raw_ostream& result,
                  std::function<void(void*, StringRef, raw_ostream&)> lookup,
                  std::function<void(const std::string&)> error) {
    // Scan the string for escape sequences or variable references, accumulating
    // output pieces as we go.
    const char* pos = string.begin();
    const char* end = string.end();
    while (pos != end) {
      // Find the next '$'.
      const char* pieceStart = pos;
      for (; pos != end; ++pos) {
        if (*pos == '$')
          break;
      }

      // Add the current piece, if non-empty.
      if (pos != pieceStart)
        result << StringRef(pieceStart, pos - pieceStart);

      // If we are at the end, we are done.
      if (pos == end)
        break;

      // Otherwise, we have a '$' character to handle.
      ++pos;
      if (pos == end) {
        error("invalid '$'-escape at end of string");
        break;
      }

      // If this is a newline continuation, skip it and all leading space.
      int c = *pos;
      if (c == '\n') {
        ++pos;
        while (pos != end && isspace(*pos))
          ++pos;
        continue;
      }

      // If this is single character escape, honor it.
      if (c == ' ' || c == ':' || c == '$') {
        result << char(c);
        ++pos;
        continue;
      }

      // If this is a braced variable reference, expand it.
      if (c == '{') {
        // Scan until the end of the reference, checking validity of the
        // identifier name as we go.
        ++pos;
        const char* varStart = pos;
        bool isValid = true;
        while (true) {
          // If we reached the end of the string, this is an error.
          if (pos == end) {
            error(
                "invalid variable reference in string (missing trailing '}')");
            break;
          }

          // If we found the end of the reference, resolve it.
          int c = *pos;
          if (c == '}') {
            // If this identifier isn't valid, emit an error.
            if (!isValid) {
              error("invalid variable name in reference");
            } else {
              lookup(userContext, StringRef(varStart, pos - varStart),
                     result);
            }
            ++pos;
            break;
          }

          // Track whether this is a valid identifier.
          if (!Lexer::isIdentifierChar(c))
            isValid = false;

          ++pos;
        }
        continue;
      }

      // If this is a simple variable reference, expand it.
      if (Lexer::isSimpleIdentifierChar(c)) {
        const char* varStart = pos;
        // Scan until the end of the simple identifier.
        ++pos;
        while (pos != end && Lexer::isSimpleIdentifierChar(*pos))
          ++pos;
        lookup(userContext, StringRef(varStart, pos-varStart), result);
        continue;
      }

      // Otherwise, we have an invalid '$' escape.
      error("invalid '$'-escape (literal '$' should be written as '$$')");
      break;
    }
  }